

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client_util.hpp
# Opt level: O0

person * rest_rpc::get_result<person>(string_view result)

{
  msgpack_codec *in_RSI;
  person *in_RDI;
  tuple<int,_person> tp;
  msgpack_codec codec;
  person *this;
  size_t in_stack_ffffffffffffffd8;
  char *in_stack_ffffffffffffffe0;
  
  this = in_RDI;
  rpc_service::msgpack_codec::msgpack_codec((msgpack_codec *)0x1f82aa);
  nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::data
            ((basic_string_view<char,_std::char_traits<char>_> *)&stack0xffffffffffffffe8);
  nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::size
            ((basic_string_view<char,_std::char_traits<char>_> *)&stack0xffffffffffffffe8);
  rpc_service::msgpack_codec::unpack<std::tuple<int,person>>
            (in_RSI,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  std::get<1ul,int,person>((tuple<int,_person> *)0x1f82ee);
  person::person(this,in_RDI);
  std::tuple<int,_person>::~tuple((tuple<int,_person> *)0x1f8306);
  rpc_service::msgpack_codec::~msgpack_codec((msgpack_codec *)0x1f8310);
  return this;
}

Assistant:

inline T get_result(string_view result) {
  rpc_service::msgpack_codec codec;
  auto tp = codec.unpack<std::tuple<int, T>>(result.data(), result.size());
  return std::get<1>(tp);
}